

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

void Assimp::ConvertListToStrings
               (string *in,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  char **ppcVar1;
  char **ppcVar2;
  char cVar3;
  Logger *this;
  char **ppcVar4;
  char *s;
  char **local_48;
  string local_40;
  
  local_48 = (char **)(in->_M_dataplus)._M_p;
  do {
    while( true ) {
      if (*(char *)local_48 == '\0') {
        return;
      }
      SkipSpacesAndLineEnd<char>((char **)&local_48);
      if (*(char *)local_48 == '\'') break;
      GetNextToken_abi_cxx11_(&local_40,(Assimp *)&local_48,local_48);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(out,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    ppcVar1 = (char **)((long)local_48 + 1);
    cVar3 = *(char *)((long)local_48 + 1);
    ppcVar2 = (char **)((long)local_48 + 2);
    local_48 = ppcVar1;
    while (ppcVar4 = ppcVar2, cVar3 != '\'') {
      cVar3 = *(char *)ppcVar4;
      ppcVar2 = (char **)((long)ppcVar4 + 1);
      local_48 = ppcVar4;
      if (cVar3 == '\0') {
        this = DefaultLogger::get();
        Logger::error(this,"ConvertListToString: String list is ill-formatted");
        return;
      }
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,ppcVar1,(char *)((long)ppcVar4 + -1));
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(out,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    local_48 = (char **)((long)local_48 + 1);
  } while( true );
}

Assistant:

void ConvertListToStrings(const std::string& in, std::list<std::string>& out)
{
    const char* s = in.c_str();
    while (*s) {
        SkipSpacesAndLineEnd(&s);
        if (*s == '\'') {
            const char* base = ++s;
            while (*s != '\'') {
                ++s;
                if (*s == '\0') {
                    ASSIMP_LOG_ERROR("ConvertListToString: String list is ill-formatted");
                    return;
                }
            }
            out.push_back(std::string(base,(size_t)(s-base)));
            ++s;
        }
        else {
            out.push_back(GetNextToken(s));
        }
    }
}